

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::IsNonNumericRegOpnd
          (GlobOpt *this,RegOpnd *opnd,bool inGlobOpt,bool *isSafeToTransferInPrepass)

{
  BOOLEAN BVar1;
  Value *pVVar2;
  bool bVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a;
  
  if (opnd != (RegOpnd *)0x0) {
    bVar3 = (bool)((opnd->m_sym->field_0x18 & 2) >> 1);
    if (!inGlobOpt || bVar3 != false) {
      return bVar3;
    }
    local_2a = (opnd->super_Opnd).m_valueType.field_0;
    bVar3 = ValueType::IsNumber((ValueType *)&local_2a.field_0);
    if ((!bVar3) &&
       (bVar3 = GlobOptBlockData::IsTypeSpecialized
                          (&this->currentBlock->globOptData,&opnd->m_sym->super_Sym), !bVar3)) {
      return true;
    }
    if (this->prePassLoop != (Loop *)0x0) {
      pVVar2 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&opnd->m_sym->super_Sym)
      ;
      if (pVVar2 == (Value *)0x0) {
        return true;
      }
      if (pVVar2->valueInfo == (ValueInfo *)0x0) {
        return true;
      }
      bVar3 = IsSafeToTransferInPrepass(this,opnd->m_sym,pVVar2->valueInfo);
      if (isSafeToTransferInPrepass != (bool *)0x0) {
        *isSafeToTransferInPrepass = bVar3;
      }
      BVar1 = BVSparse<Memory::JitArenaAllocator>::Test
                        (this->prePassLoop->preservesNumberValue,(opnd->m_sym->super_Sym).m_id);
      return !bVar3 && BVar1 == '\0';
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::IsNonNumericRegOpnd(IR::RegOpnd* opnd, bool inGlobOpt, bool* isSafeToTransferInPrepass /*=nullptr*/) const
{
    if (opnd == nullptr)
    {
        return false;
    }

    if (opnd->m_sym->m_isNotNumber)
    {
        return true;
    }

    if (!inGlobOpt)
    {
        return false;
    }

    if (opnd->GetValueType().IsNumber() || currentBlock->globOptData.IsTypeSpecialized(opnd->m_sym))
    {
        if (!this->IsLoopPrePass())
        {
            return false;
        }

        Value * opndValue = this->currentBlock->globOptData.FindValue(opnd->m_sym);
        ValueInfo * opndValueInfo = opndValue ? opndValue->GetValueInfo() : nullptr;
        if (!opndValueInfo)
        {
            return true;
        }

        bool isSafeToTransfer = this->IsSafeToTransferInPrepass(opnd->m_sym, opndValueInfo);
        if (isSafeToTransferInPrepass != nullptr)
        {
            *isSafeToTransferInPrepass = isSafeToTransfer;
        }
        if (this->prePassLoop->preservesNumberValue->Test(opnd->m_sym->m_id))
        {
            return false;
        }

        return !isSafeToTransfer;
    }

    return true;
}